

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O3

int cfg_tobin_int(void *reference,size_t bin_size,const_strarray *value,uint16_t fraction,
                 size_t int_size)

{
  int iVar1;
  uint64_t scaling;
  ulong uVar2;
  int64_t i;
  int64_t local_18;
  
  iVar1 = -1;
  if (bin_size == int_size) {
    local_18 = 0xffffffff;
    if (fraction == 0) {
      scaling = 1;
    }
    else {
      uVar2 = (ulong)fraction;
      scaling = 1;
      do {
        scaling = scaling * 10;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    iVar1 = isonumber_to_s64(&local_18,value->value,scaling);
    if (iVar1 == 0) {
      if (bin_size == 8) {
        *(int64_t *)reference = local_18;
      }
      else {
        if (bin_size != 4) {
          return -1;
        }
        *(undefined4 *)reference = (undefined4)local_18;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_int(void *reference, size_t bin_size, const struct const_strarray *value, uint16_t fraction, size_t int_size) {
  int64_t i;
  int result;
  uint64_t j, scaling;

  if (bin_size != int_size) {
    return -1;
  }

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  result = isonumber_to_s64(&i, strarray_get_first_c(value), scaling);
  if (result == 0) {
    switch (int_size) {
      case 4:
        *((int32_t *)reference) = i;
        break;
      case 8:
        *((int64_t *)reference) = i;
        break;
      default:
        return -1;
    }
  }
  return result;
}